

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O0

PipelineFor<DynamicStruct> *
capnp::DynamicValue::Pipeline::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
          (PipelineFor<DynamicStruct> *__return_storage_ptr__,Pipeline *pipeline)

{
  Pipeline *pPVar1;
  Fault local_20;
  Fault f;
  Pipeline *pipeline_local;
  
  f.exception = (Exception *)pipeline;
  if (pipeline->type == STRUCT) {
    pPVar1 = kj::mv<capnp::DynamicStruct::Pipeline>(&(pipeline->field_1).structValue);
    DynamicStruct::Pipeline::Pipeline(__return_storage_ptr__,pPVar1);
    return __return_storage_ptr__;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[24]>
            (&local_20,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic.c++"
             ,0x717,FAILED,"pipeline.type == STRUCT","\"Pipeline type mismatch.\"",
             (char (*) [24])"Pipeline type mismatch.");
  kj::_::Debug::Fault::fatal(&local_20);
}

Assistant:

PipelineFor<DynamicStruct> DynamicValue::Pipeline::AsImpl<DynamicStruct>::apply(
    Pipeline& pipeline) {
  KJ_REQUIRE(pipeline.type == STRUCT, "Pipeline type mismatch.");
  return kj::mv(pipeline.structValue);
}